

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O3

void deqp::gles3::Functional::DepthStencilCaseUtil::generateDepthVisualizeCommands
               (TestRenderTarget *target,
               vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
               *commands)

{
  float *pfVar1;
  int ndx;
  long lVar2;
  value_type local_a4;
  
  pfVar1 = generateDepthVisualizeCommands::depthSteps;
  lVar2 = 0;
  do {
    local_a4.params.stencilTestEnabled = false;
    local_a4.params.stencil[1].depthPassOp = 0;
    local_a4.params.stencil[1].writeMask = 0;
    local_a4.params.stencil[1].reference = 0;
    local_a4.params.stencil[1].compareMask = 0;
    local_a4.params.stencil[1].stencilFailOp = 0;
    local_a4.params.stencil[1].depthFailOp = 0;
    local_a4.params.stencil[0].depthFailOp = 0;
    local_a4.params.stencil[0].depthPassOp = 0;
    local_a4.params.stencil[0].writeMask = 0;
    local_a4.params.stencil[1].function = 0;
    local_a4.params.stencil[0].function = 0;
    local_a4.params.stencil[0].reference = 0;
    local_a4.params.stencil[0].compareMask = 0;
    local_a4.params.stencil[0].stencilFailOp = 0;
    local_a4.params.visibleFace = FACETYPE_FRONT;
    local_a4.rect.left = 0;
    local_a4.rect.bottom = 0;
    local_a4.rect.width = target->width;
    local_a4.rect.height = target->height;
    local_a4.color.m_data[0] = 0.0;
    local_a4.color.m_data[1] = 0.0;
    local_a4.color.m_data[2] = (float)(int)lVar2 * 0.25;
    local_a4.color.m_data[3] = 0.0;
    local_a4.colorMask.m_data[0] = false;
    local_a4.colorMask.m_data[1] = false;
    local_a4.colorMask.m_data[2] = true;
    local_a4.colorMask.m_data[3] = false;
    local_a4.params.depth = *pfVar1 + -0.05;
    local_a4.params.depthTestEnabled = true;
    local_a4.params.depthFunc = 0x201;
    local_a4.params.depthWriteMask = false;
    std::
    vector<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
    ::push_back(commands,&local_a4);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

void generateDepthVisualizeCommands (const TestRenderTarget& target, vector<RenderCommand>& commands)
{
	const float			epsilon			= -0.05f;
	static const float	depthSteps[]	= {-1.0f, -0.5f, 0.0f, 0.5f, 1.0f};
	int					numSteps		= DE_LENGTH_OF_ARRAY(depthSteps);
	const float			colorStep		= 1.0f / (float)(numSteps-1);

	for (int ndx = 0; ndx < numSteps; ndx++)
	{
		RenderCommand cmd;

		cmd.params.visibleFace		= rr::FACETYPE_FRONT;
		cmd.rect					= rr::WindowRectangle(0, 0, target.width, target.height);
		cmd.color					= Vec4(0.0f, 0.0f, colorStep*(float)ndx, 0.0f);
		cmd.colorMask				= tcu::BVec4(false, false, true, false);
		cmd.params.depth			= depthSteps[ndx]+epsilon;
		cmd.params.depthTestEnabled	= true;
		cmd.params.depthFunc		= GL_LESS;
		cmd.params.depthWriteMask	= false;

		commands.push_back(cmd);
	}
}